

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

void cpool_shutdown_discard_all(cpool *cpool)

{
  Curl_llist_node *n;
  connectdata *conn;
  
  n = Curl_llist_head(&cpool->shutdowns);
  if (n != (Curl_llist_node *)0x0) {
    while (n != (Curl_llist_node *)0x0) {
      conn = (connectdata *)Curl_node_elem(n);
      Curl_node_remove(n);
      cpool_close_and_destroy(cpool,conn,(Curl_easy *)0x0,false);
      n = Curl_llist_head(&cpool->shutdowns);
    }
  }
  return;
}

Assistant:

static void cpool_shutdown_discard_all(struct cpool *cpool)
{
  struct Curl_llist_node *e = Curl_llist_head(&cpool->shutdowns);
  struct connectdata *conn;

  if(!e)
    return;

  DEBUGF(infof(cpool->idata, "cpool_shutdown_discard_all"));
  while(e) {
    conn = Curl_node_elem(e);
    Curl_node_remove(e);
    DEBUGF(infof(cpool->idata, "discard connection #%" FMT_OFF_T,
                 conn->connection_id));
    cpool_close_and_destroy(cpool, conn, NULL, FALSE);
    e = Curl_llist_head(&cpool->shutdowns);
  }
}